

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O2

BrotliDecoderErrorCode
DecodeContextMap(uint32_t context_map_size,uint32_t *num_htrees,uint8_t **context_map_arg,
                BrotliDecoderStateInternal *s)

{
  BrotliBitReader *br;
  size_t sVar1;
  byte *pbVar2;
  BrotliDecoderErrorCode BVar3;
  uint8_t *puVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  BrotliRunningContextMapState BVar11;
  ulong uVar12;
  uint uVar13;
  HuffmanCode *pHVar14;
  uint32_t code;
  uint8_t **local_40;
  uint32_t local_34;
  
  if (BROTLI_STATE_CONTEXT_MAP_TRANSFORM < s->substate_context_map) {
    return BROTLI_DECODER_ERROR_UNREACHABLE;
  }
  br = &s->br;
  uVar9 = (ulong)context_map_size;
  local_40 = context_map_arg;
  switch(s->substate_context_map) {
  case BROTLI_STATE_CONTEXT_MAP_NONE:
    BVar3 = DecodeVarLenUint8(s,br,num_htrees);
    if (BVar3 != BROTLI_DECODER_SUCCESS) {
      return BVar3;
    }
    *num_htrees = *num_htrees + 1;
    s->context_index = 0;
    puVar4 = (uint8_t *)(*s->alloc_func)(s->memory_manager_opaque,uVar9);
    *local_40 = puVar4;
    if (puVar4 == (uint8_t *)0x0) {
      return BROTLI_DECODER_ERROR_ALLOC_CONTEXT_MAP;
    }
    if (*num_htrees < 2) {
      memset(puVar4,0,uVar9);
      return BROTLI_DECODER_SUCCESS;
    }
    s->substate_context_map = BROTLI_STATE_CONTEXT_MAP_READ_PREFIX;
  case BROTLI_STATE_CONTEXT_MAP_READ_PREFIX:
    uVar5 = (s->br).bit_pos_;
    while (uVar5 - 0x3c < 5) {
      sVar1 = (s->br).avail_in;
      if (sVar1 == 0) {
        return BROTLI_DECODER_NEEDS_MORE_INPUT;
      }
      uVar12 = (s->br).val_;
      pbVar2 = (s->br).next_in;
      (s->br).val_ = uVar12 >> 8;
      (s->br).val_ = (ulong)*pbVar2 << 0x38 | uVar12 >> 8;
      uVar5 = uVar5 - 8;
      (s->br).bit_pos_ = uVar5;
      (s->br).avail_in = sVar1 - 1;
      (s->br).next_in = pbVar2 + 1;
    }
    uVar13 = (uint)((s->br).val_ >> ((byte)uVar5 & 0x3f));
    uVar10 = uVar13 & 1;
    uVar6 = (uVar13 >> 1 & 0xf) + 1 & -uVar10;
    s->max_run_length_prefix = uVar6;
    (s->br).bit_pos_ = uVar5 + uVar10 * 4 + 1;
    s->substate_context_map = BROTLI_STATE_CONTEXT_MAP_HUFFMAN;
    break;
  case BROTLI_STATE_CONTEXT_MAP_HUFFMAN:
    uVar6 = s->max_run_length_prefix;
    break;
  case BROTLI_STATE_CONTEXT_MAP_DECODE:
    code = s->code;
    goto LAB_001035ea;
  case BROTLI_STATE_CONTEXT_MAP_TRANSFORM:
switchD_001034a9_caseD_4:
    BVar3 = BROTLI_DECODER_SUCCESS;
    uVar9 = (ulong)(s->br).bit_pos_;
    BVar11 = BROTLI_STATE_CONTEXT_MAP_TRANSFORM;
    do {
      if ((int)uVar9 != 0x40) {
        (s->br).bit_pos_ = (int)uVar9 + 1;
        BVar11 = BROTLI_STATE_CONTEXT_MAP_NONE;
        if (((s->br).val_ >> (uVar9 & 0x3f) & 1) != 0) {
          InverseMoveToFrontTransform(*local_40,context_map_size,s);
        }
LAB_00103828:
        s->substate_context_map = BVar11;
        return BVar3;
      }
      sVar1 = (s->br).avail_in;
      if (sVar1 == 0) {
        BVar3 = BROTLI_DECODER_NEEDS_MORE_INPUT;
        goto LAB_00103828;
      }
      uVar9 = (s->br).val_;
      pbVar2 = (s->br).next_in;
      (s->br).val_ = uVar9 >> 8;
      (s->br).val_ = (ulong)*pbVar2 << 0x38 | uVar9 >> 8;
      (s->br).bit_pos_ = 0x38;
      (s->br).avail_in = sVar1 - 1;
      (s->br).next_in = pbVar2 + 1;
      uVar9 = 0x38;
    } while( true );
  }
  BVar3 = ReadHuffmanCode(uVar6 + *num_htrees,s->context_map_table,(uint32_t *)0x0,s);
  if (BVar3 == BROTLI_DECODER_SUCCESS) {
    s->code = 0xffff;
    s->substate_context_map = BROTLI_STATE_CONTEXT_MAP_DECODE;
    code = 0xffff;
LAB_001035ea:
    uVar10 = s->context_index;
    uVar12 = (ulong)uVar10;
    local_34 = s->max_run_length_prefix;
    puVar4 = *local_40;
    if (code == 0xffff) goto LAB_001036ad;
LAB_00103611:
    uVar6 = (s->br).bit_pos_;
    for (iVar7 = -uVar6; uVar6 = uVar6 - 8, iVar7 + 0x40U < code; iVar7 = iVar7 + 8) {
      sVar1 = (s->br).avail_in;
      if (sVar1 == 0) {
LAB_00103835:
        s->code = code;
        s->context_index = (uint32_t)uVar12;
        return BROTLI_DECODER_NEEDS_MORE_INPUT;
      }
      uVar8 = (s->br).val_;
      pbVar2 = (s->br).next_in;
      (s->br).val_ = uVar8 >> 8;
      (s->br).val_ = (ulong)*pbVar2 << 0x38 | uVar8 >> 8;
      (s->br).bit_pos_ = uVar6;
      (s->br).avail_in = sVar1 - 1;
      (s->br).next_in = pbVar2 + 1;
    }
    uVar10 = kBitMask[code];
    (s->br).bit_pos_ = code - iVar7;
    iVar7 = (1 << ((byte)code & 0x1f)) + ((uint)((s->br).val_ >> (-(char)iVar7 & 0x3fU)) & uVar10);
    if ((uint)(iVar7 + (int)uVar12) <= context_map_size) {
      do {
        uVar8 = uVar12 & 0xffffffff;
        uVar10 = (int)uVar12 + 1;
        uVar12 = (ulong)uVar10;
        puVar4[uVar8] = '\0';
        iVar7 = iVar7 + -1;
      } while (iVar7 != 0);
LAB_001036ad:
      uVar12 = (ulong)uVar10;
      do {
        if (uVar9 <= uVar12) goto switchD_001034a9_caseD_4;
        for (uVar10 = (s->br).bit_pos_ - 0x32; uVar10 < 0xf; uVar10 = uVar10 - 8) {
          sVar1 = (s->br).avail_in;
          if (sVar1 == 0) {
            iVar7 = SafeDecodeSymbol(s->context_map_table,br,&code);
            if (iVar7 != 0) goto LAB_00103786;
            code = 0xffff;
            goto LAB_00103835;
          }
          uVar8 = (s->br).val_;
          pbVar2 = (s->br).next_in;
          (s->br).val_ = uVar8 >> 8;
          (s->br).val_ = (ulong)*pbVar2 << 0x38 | uVar8 >> 8;
          (s->br).bit_pos_ = uVar10 + 0x2a;
          (s->br).avail_in = sVar1 - 1;
          (s->br).next_in = pbVar2 + 1;
        }
        iVar7 = uVar10 + 0x32;
        uVar8 = br->val_ >> ((byte)iVar7 & 0x3f);
        pHVar14 = s->context_map_table + (uVar8 & 0xff);
        uVar13 = (uint)pHVar14->bits;
        if (8 < uVar13) {
          iVar7 = uVar10 + 0x3a;
          pHVar14 = pHVar14 + (ulong)pHVar14->value +
                              (ulong)((uint)(uVar8 >> 8) & 0xffffff & kBitMask[pHVar14->bits - 8] &
                                     0x7f);
          uVar13 = (uint)pHVar14->bits;
        }
        (s->br).bit_pos_ = uVar13 + iVar7;
        code = (uint32_t)pHVar14->value;
LAB_00103786:
        if (code == 0) {
          iVar7 = 0;
        }
        else {
          iVar7 = code - local_34;
          if (code < local_34 || iVar7 == 0) goto LAB_00103611;
        }
        puVar4[uVar12] = (uint8_t)iVar7;
        uVar12 = uVar12 + 1;
      } while( true );
    }
    BVar3 = BROTLI_DECODER_ERROR_FORMAT_CONTEXT_MAP_REPEAT;
  }
  return BVar3;
}

Assistant:

static BrotliDecoderErrorCode DecodeContextMap(uint32_t context_map_size,
                                               uint32_t* num_htrees,
                                               uint8_t** context_map_arg,
                                               BrotliDecoderState* s) {
  BrotliBitReader* br = &s->br;
  BrotliDecoderErrorCode result = BROTLI_DECODER_SUCCESS;

  switch ((int)s->substate_context_map) {
    case BROTLI_STATE_CONTEXT_MAP_NONE:
      result = DecodeVarLenUint8(s, br, num_htrees);
      if (result != BROTLI_DECODER_SUCCESS) {
        return result;
      }
      (*num_htrees)++;
      s->context_index = 0;
      BROTLI_LOG_UINT(context_map_size);
      BROTLI_LOG_UINT(*num_htrees);
      *context_map_arg = (uint8_t*)BROTLI_ALLOC(s, (size_t)context_map_size);
      if (*context_map_arg == 0) {
        return BROTLI_FAILURE(BROTLI_DECODER_ERROR_ALLOC_CONTEXT_MAP);
      }
      if (*num_htrees <= 1) {
        memset(*context_map_arg, 0, (size_t)context_map_size);
        return BROTLI_DECODER_SUCCESS;
      }
      s->substate_context_map = BROTLI_STATE_CONTEXT_MAP_READ_PREFIX;
      /* No break, continue to next state. */
    case BROTLI_STATE_CONTEXT_MAP_READ_PREFIX: {
      uint32_t bits;
      /* In next stage ReadHuffmanCode uses at least 4 bits, so it is safe
         to peek 4 bits ahead. */
      if (!BrotliSafeGetBits(br, 5, &bits)) {
        return BROTLI_DECODER_NEEDS_MORE_INPUT;
      }
      if ((bits & 1) != 0) { /* Use RLE for zeros. */
        s->max_run_length_prefix = (bits >> 1) + 1;
        BrotliDropBits(br, 5);
      } else {
        s->max_run_length_prefix = 0;
        BrotliDropBits(br, 1);
      }
      BROTLI_LOG_UINT(s->max_run_length_prefix);
      s->substate_context_map = BROTLI_STATE_CONTEXT_MAP_HUFFMAN;
      /* No break, continue to next state. */
    }
    case BROTLI_STATE_CONTEXT_MAP_HUFFMAN:
      result = ReadHuffmanCode(*num_htrees + s->max_run_length_prefix,
                               s->context_map_table, NULL, s);
      if (result != BROTLI_DECODER_SUCCESS) return result;
      s->code = 0xFFFF;
      s->substate_context_map = BROTLI_STATE_CONTEXT_MAP_DECODE;
      /* No break, continue to next state. */
    case BROTLI_STATE_CONTEXT_MAP_DECODE: {
      uint32_t context_index = s->context_index;
      uint32_t max_run_length_prefix = s->max_run_length_prefix;
      uint8_t* context_map = *context_map_arg;
      uint32_t code = s->code;
      if (code != 0xFFFF) {
        goto rleCode;
      }
      while (context_index < context_map_size) {
        if (!SafeReadSymbol(s->context_map_table, br, &code)) {
          s->code = 0xFFFF;
          s->context_index = context_index;
          return BROTLI_DECODER_NEEDS_MORE_INPUT;
        }
        BROTLI_LOG_UINT(code);

        if (code == 0) {
          context_map[context_index++] = 0;
          continue;
        }
        if (code > max_run_length_prefix) {
          context_map[context_index++] =
              (uint8_t)(code - max_run_length_prefix);
          continue;
        }
rleCode:
        {
          uint32_t reps;
          if (!BrotliSafeReadBits(br, code, &reps)) {
            s->code = code;
            s->context_index = context_index;
            return BROTLI_DECODER_NEEDS_MORE_INPUT;
          }
          reps += 1U << code;
          BROTLI_LOG_UINT(reps);
          if (context_index + reps > context_map_size) {
            return
                BROTLI_FAILURE(BROTLI_DECODER_ERROR_FORMAT_CONTEXT_MAP_REPEAT);
          }
          do {
            context_map[context_index++] = 0;
          } while (--reps);
        }
      }
      /* No break, continue to next state. */
    }
    case BROTLI_STATE_CONTEXT_MAP_TRANSFORM: {
      uint32_t bits;
      if (!BrotliSafeReadBits(br, 1, &bits)) {
        s->substate_context_map = BROTLI_STATE_CONTEXT_MAP_TRANSFORM;
        return BROTLI_DECODER_NEEDS_MORE_INPUT;
      }
      if (bits != 0) {
        InverseMoveToFrontTransform(*context_map_arg, context_map_size, s);
      }
      s->substate_context_map = BROTLI_STATE_CONTEXT_MAP_NONE;
      return BROTLI_DECODER_SUCCESS;
    }
    default:
      return
          BROTLI_FAILURE(BROTLI_DECODER_ERROR_UNREACHABLE);
  }
}